

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.hpp
# Opt level: O3

event_process_result __thiscall
afsm::
state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
::process_event<afsm::test::events::command_complete>
          (state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
           *this,command_complete *event)

{
  __atomic_flag_data_type _Var1;
  event_process_result eVar2;
  process_type<actions::event_process_result::process> local_11;
  
  if ((this->queue_size_).super___atomic_base<unsigned_long>._M_i == 0) {
    LOCK();
    _Var1 = (this->is_top_).super___atomic_flag_base._M_i;
    (this->is_top_).super___atomic_flag_base._M_i = true;
    UNLOCK();
    if (_Var1 == false) {
      eVar2 = process_event_impl<afsm::test::events::command_complete>(this,event,&local_11);
      LOCK();
      (this->is_top_).super___atomic_flag_base._M_i = false;
      UNLOCK();
      process_event_queue(this);
      return eVar2;
    }
  }
  enqueue_event<afsm::test::events::command_complete>(this,event);
  return defer;
}

Assistant:

actions::event_process_result
    process_event( Event&& event )
    {
        if (!queue_size_ && !is_top_.test_and_set()) {
            auto res = process_event_dispatch(::std::forward<Event>(event));
            is_top_.clear();
            // Process enqueued events
            process_event_queue();
            return res;
        } else {
            // Enqueue event
            enqueue_event(::std::forward<Event>(event));
            return actions::event_process_result::defer;
        }
    }